

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_plain
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  error_flags eVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  csubstr local_50;
  long local_40;
  size_t local_38;
  
  uVar8 = s.len;
  pcVar9 = s.str;
  local_40 = ilevel + 1;
  uVar6 = 0;
  uVar7 = 0;
  while( true ) {
    do {
      if (uVar8 == uVar6) {
        if (uVar7 <= uVar8 && uVar8 - uVar7 != 0) {
          basic_substring<const_char>::basic_substring(&local_50,pcVar9 + uVar7,uVar8 - uVar7);
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,local_50);
        }
        return;
      }
      uVar1 = uVar6 + 1;
      pcVar2 = pcVar9 + uVar6;
      uVar6 = uVar1;
    } while (*pcVar2 != '\n');
    if (uVar8 < uVar7) break;
    uVar10 = uVar1;
    if (uVar1 == 0xffffffffffffffff) {
      uVar10 = uVar8;
    }
    local_38 = uVar10 - uVar7;
    if (uVar10 < uVar7) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      handle_error(0x1ea013,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1546,"first <= last");
    }
    if (uVar8 < uVar10) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      handle_error(0x1ea013,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring<const_char>::basic_substring(&local_50,pcVar9 + uVar7,local_38);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,local_50);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\n');
    lVar11 = local_40;
    uVar7 = uVar1;
    if (uVar1 < uVar8) {
      while (lVar11 != 0) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        lVar11 = lVar11 + -1;
      }
    }
  }
  eVar5 = get_error_flags();
  if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
  handle_error(0x1ea013,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1544,"first >= 0 && first <= len");
}

Assistant:

void Emitter<Writer>::_write_scalar_plain(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
}